

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O1

void flatbuffers::tests::IntegerBoundaryTest(void)

{
  char cVar1;
  uchar uVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  unsigned_long uVar8;
  
  TestEq<int,int>(-0x7fffffff,-0x7fffffff,
                  "\'flatbuffers::numeric_limits<int32_t>::min() + 1\' != \'-2147483647\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                  ,0x262,"");
  TestEq<long_long,long_long>
            (-0x7fffffffffffffff,-0x7fffffffffffffff,
             "\'flatbuffers::numeric_limits<int64_t>::min() + 1LL\' != \'-9223372036854775807LL\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x265,"");
  cVar1 = TestValue<signed_char>("{ y:127 }","byte",(char *)0x0);
  TestEq<signed_char,int>
            (cVar1,0x7f,"\'TestValue<int8_t>(\"{ y:127 }\", \"byte\")\' != \'127\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x26d,"");
  cVar1 = TestValue<signed_char>("{ y:-128 }","byte",(char *)0x0);
  TestEq<signed_char,int>
            (cVar1,-0x80,"\'TestValue<int8_t>(\"{ y:-128 }\", \"byte\")\' != \'-128\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x26e,"");
  uVar2 = TestValue<unsigned_char>("{ y:255 }","ubyte",(char *)0x0);
  TestEq<unsigned_char,int>
            (uVar2,0xff,"\'TestValue<uint8_t>(\"{ y:255 }\", \"ubyte\")\' != \'255\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x26f,"");
  uVar2 = TestValue<unsigned_char>("{ y:0 }","ubyte",(char *)0x0);
  TestEq<unsigned_char,int>
            (uVar2,0,"\'TestValue<uint8_t>(\"{ y:0 }\", \"ubyte\")\' != \'0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x270,"");
  sVar3 = TestValue<short>("{ y:32767 }","short",(char *)0x0);
  TestEq<short,int>(sVar3,0x7fff,"\'TestValue<int16_t>(\"{ y:32767 }\", \"short\")\' != \'32767\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x271,"");
  sVar3 = TestValue<short>("{ y:-32768 }","short",(char *)0x0);
  TestEq<short,int>(sVar3,-0x8000,
                    "\'TestValue<int16_t>(\"{ y:-32768 }\", \"short\")\' != \'-32768\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x272,"");
  uVar4 = TestValue<unsigned_short>("{ y:65535 }","ushort",(char *)0x0);
  TestEq<unsigned_short,int>
            (uVar4,0xffff,"\'TestValue<uint16_t>(\"{ y:65535 }\", \"ushort\")\' != \'65535\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x273,"");
  uVar4 = TestValue<unsigned_short>("{ y:0 }","ushort",(char *)0x0);
  TestEq<unsigned_short,int>
            (uVar4,0,"\'TestValue<uint16_t>(\"{ y:0 }\", \"ushort\")\' != \'0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x274,"");
  iVar5 = TestValue<int>("{ y:2147483647 }","int",(char *)0x0);
  TestEq<int,int>(iVar5,0x7fffffff,
                  "\'TestValue<int32_t>(\"{ y:2147483647 }\", \"int\")\' != \'2147483647\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                  ,0x275,"");
  iVar5 = TestValue<int>("{ y:-2147483648 }","int",(char *)0x0);
  TestEq<int,int>(iVar5 + 1,-0x7fffffff,
                  "\'TestValue<int32_t>(\"{ y:-2147483648 }\", \"int\") + 1\' != \'-2147483647\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                  ,0x276,"");
  uVar6 = TestValue<unsigned_int>("{ y:4294967295 }","uint",(char *)0x0);
  TestEq<unsigned_int,long>
            (uVar6,0xffffffff,
             "\'TestValue<uint32_t>(\"{ y:4294967295 }\", \"uint\")\' != \'4294967295\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x277,"");
  uVar6 = TestValue<unsigned_int>("{ y:0 }","uint",(char *)0x0);
  TestEq<unsigned_int,int>
            (uVar6,0,"\'TestValue<uint32_t>(\"{ y:0 }\", \"uint\")\' != \'0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x278,"");
  lVar7 = TestValue<long>("{ y:9223372036854775807 }","long",(char *)0x0);
  TestEq<long,long_long>
            (lVar7,0x7fffffffffffffff,
             "\'TestValue<int64_t>(\"{ y:9223372036854775807 }\", \"long\")\' != \'9223372036854775807LL\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x27a,"");
  lVar7 = TestValue<long>("{ y:-9223372036854775808 }","long",(char *)0x0);
  TestEq<long_long,long_long>
            (lVar7 + 1,-0x7fffffffffffffff,
             "\'TestValue<int64_t>(\"{ y:-9223372036854775808 }\", \"long\") + 1LL\' != \'-9223372036854775807LL\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x27c,"");
  uVar8 = TestValue<unsigned_long>("{ y:18446744073709551615 }","ulong",(char *)0x0);
  TestEq<unsigned_long,unsigned_long_long>
            (uVar8,0xffffffffffffffff,
             "\'TestValue<uint64_t>(\"{ y:18446744073709551615 }\", \"ulong\")\' != \'18446744073709551615ULL\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x27e,"");
  uVar8 = TestValue<unsigned_long>("{ y:0 }","ulong",(char *)0x0);
  TestEq<unsigned_long,int>
            (uVar8,0,"\'TestValue<uint64_t>(\"{ y:0 }\", \"ulong\")\' != \'0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x27f,"");
  uVar8 = TestValue<unsigned_long>("{ y: 18446744073709551615 }","uint64",(char *)0x0);
  TestEq<unsigned_long,unsigned_long_long>
            (uVar8,0xffffffffffffffff,
             "\'TestValue<uint64_t>(\"{ y: 18446744073709551615 }\", \"uint64\")\' != \'18446744073709551615ULL\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x281,"");
  uVar8 = TestValue<unsigned_long>((char *)0x0,"uint64 = 18446744073709551615",(char *)0x0);
  TestEq<unsigned_long,unsigned_long_long>
            (uVar8,0xffffffffffffffff,
             "\'TestValue<uint64_t>(nullptr, \"uint64 = 18446744073709551615\")\' != \'18446744073709551615ULL\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
             ,0x284,"");
  return;
}

Assistant:

void IntegerBoundaryTest() {
  // Check numerical compatibility with non-C++ languages.
  // By the C++ standard, std::numerical_limits<int64_t>::min() ==
  // -9223372036854775807 (-2^63+1) or less* The Flatbuffers grammar and most of
  // the languages (C#, Java, Rust) expect that minimum values are: -128,
  // -32768,.., -9223372036854775808. Since C++20,
  // static_cast<int64>(0x8000000000000000ULL) is well-defined two's complement
  // cast. Therefore -9223372036854775808 should be valid negative value.
  TEST_EQ(flatbuffers::numeric_limits<int8_t>::min(), -128);
  TEST_EQ(flatbuffers::numeric_limits<int8_t>::max(), 127);
  TEST_EQ(flatbuffers::numeric_limits<int16_t>::min(), -32768);
  TEST_EQ(flatbuffers::numeric_limits<int16_t>::max(), 32767);
  TEST_EQ(flatbuffers::numeric_limits<int32_t>::min() + 1, -2147483647);
  TEST_EQ(flatbuffers::numeric_limits<int32_t>::max(), 2147483647ULL);
  TEST_EQ(flatbuffers::numeric_limits<int64_t>::min() + 1LL,
          -9223372036854775807LL);
  TEST_EQ(flatbuffers::numeric_limits<int64_t>::max(), 9223372036854775807ULL);
  TEST_EQ(flatbuffers::numeric_limits<uint8_t>::max(), 255);
  TEST_EQ(flatbuffers::numeric_limits<uint16_t>::max(), 65535);
  TEST_EQ(flatbuffers::numeric_limits<uint32_t>::max(), 4294967295ULL);
  TEST_EQ(flatbuffers::numeric_limits<uint64_t>::max(),
          18446744073709551615ULL);

  TEST_EQ(TestValue<int8_t>("{ y:127 }", "byte"), 127);
  TEST_EQ(TestValue<int8_t>("{ y:-128 }", "byte"), -128);
  TEST_EQ(TestValue<uint8_t>("{ y:255 }", "ubyte"), 255);
  TEST_EQ(TestValue<uint8_t>("{ y:0 }", "ubyte"), 0);
  TEST_EQ(TestValue<int16_t>("{ y:32767 }", "short"), 32767);
  TEST_EQ(TestValue<int16_t>("{ y:-32768 }", "short"), -32768);
  TEST_EQ(TestValue<uint16_t>("{ y:65535 }", "ushort"), 65535);
  TEST_EQ(TestValue<uint16_t>("{ y:0 }", "ushort"), 0);
  TEST_EQ(TestValue<int32_t>("{ y:2147483647 }", "int"), 2147483647);
  TEST_EQ(TestValue<int32_t>("{ y:-2147483648 }", "int") + 1, -2147483647);
  TEST_EQ(TestValue<uint32_t>("{ y:4294967295 }", "uint"), 4294967295);
  TEST_EQ(TestValue<uint32_t>("{ y:0 }", "uint"), 0);
  TEST_EQ(TestValue<int64_t>("{ y:9223372036854775807 }", "long"),
          9223372036854775807LL);
  TEST_EQ(TestValue<int64_t>("{ y:-9223372036854775808 }", "long") + 1LL,
          -9223372036854775807LL);
  TEST_EQ(TestValue<uint64_t>("{ y:18446744073709551615 }", "ulong"),
          18446744073709551615ULL);
  TEST_EQ(TestValue<uint64_t>("{ y:0 }", "ulong"), 0);
  TEST_EQ(TestValue<uint64_t>("{ y: 18446744073709551615 }", "uint64"),
          18446744073709551615ULL);
  // check that the default works
  TEST_EQ(TestValue<uint64_t>(nullptr, "uint64 = 18446744073709551615"),
          18446744073709551615ULL);
}